

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  TestCaseInfo *pTVar1;
  pointer pcVar2;
  pointer pSVar3;
  pointer pSVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  pointer this_00;
  SectionInfo testCaseSection;
  SectionStats testCaseSectionStats;
  Counts diff;
  string *local_148;
  string local_138;
  string *local_118;
  undefined8 local_110;
  undefined1 local_108 [32];
  string local_e8;
  uint64_t local_c8;
  uint64_t uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  double local_a8;
  undefined1 local_a0;
  uint64_t local_78;
  uint64_t uStack_70;
  uint64_t local_68;
  uint64_t uStack_60;
  Counts local_58;
  
  pTVar1 = this->m_activeTestCase->m_info;
  pcVar2 = (pTVar1->name)._M_dataplus._M_p;
  local_118 = (string *)local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  uVar5 = local_110;
  local_148 = &local_138;
  if (local_118 == (string *)local_108) {
    local_138._M_string_length = local_108._8_8_;
  }
  else {
    local_148 = local_118;
  }
  local_138._M_dataplus._M_p._1_7_ = local_108._1_7_;
  local_138._M_dataplus._M_p._0_1_ = local_108[0];
  local_110 = 0;
  local_108[0] = 0;
  local_138.field_2._M_allocated_capacity = (size_type)(pTVar1->lineInfo).file;
  local_138.field_2._8_8_ = (pTVar1->lineInfo).line;
  local_118 = (string *)local_108;
  (*((this->m_reporter).m_ptr)->_vptr_IEventListener[7])();
  local_78 = (this->m_totals).assertions.passed;
  uStack_70 = (this->m_totals).assertions.failed;
  local_68 = (this->m_totals).assertions.failedButOk;
  uStack_60 = (this->m_totals).assertions.skipped;
  this->m_shouldReportUnexpected = true;
  local_108._16_8_ = (pTVar1->lineInfo).file;
  local_108._24_8_ = (pTVar1->lineInfo).line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_108._16_8_;
  (this->m_lastAssertionInfo).lineInfo.line = local_108._24_8_;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  if ((((this->m_reporter).m_ptr)->m_preferences).shouldRedirectStdOut == true) {
    RedirectedStreams::RedirectedStreams
              ((RedirectedStreams *)(local_108 + 0x10),redirectedCout,redirectedCerr);
    lVar7 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams((RedirectedStreams *)(local_108 + 0x10));
  }
  else {
    lVar7 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  local_58.passed = (this->m_totals).assertions.passed - local_78;
  local_58.failed = (this->m_totals).assertions.failed - uStack_70;
  local_58.failedButOk = (this->m_totals).assertions.failedButOk - local_68;
  local_58.skipped = (this->m_totals).assertions.skipped - uStack_60;
  bVar6 = testForMissingAssertions(this,&local_58);
  (*this->m_testCaseTracker->_vptr_ITracker[3])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar3 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar3;
  if (pSVar4 != pSVar3) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar4);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar3;
  }
  if (local_148 == &local_138) {
    local_e8._M_string_length = local_138._M_string_length;
    local_108._16_8_ = &local_e8;
  }
  else {
    local_108._16_8_ = local_148;
  }
  local_e8._M_dataplus._M_p = local_138._M_dataplus._M_p;
  local_108._24_8_ = uVar5;
  local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffffffffff00;
  local_e8.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
  local_e8.field_2._8_8_ = local_138.field_2._8_8_;
  local_c8 = local_58.passed;
  uStack_c0 = local_58.failed;
  local_b8 = (undefined4)local_58.failedButOk;
  uStack_b4 = local_58.failedButOk._4_4_;
  uStack_b0 = (undefined4)local_58.skipped;
  uStack_ac = local_58.skipped._4_4_;
  local_a8 = (double)((ulong)(lVar8 - lVar7) / 1000) / 1000000.0;
  local_a0 = bVar6;
  (*((this->m_reporter).m_ptr)->_vptr_IEventListener[0xe])();
  if ((string *)local_108._16_8_ != &local_e8) {
    operator_delete((void *)local_108._16_8_,(ulong)(local_e8._M_dataplus._M_p + 1));
  }
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }